

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

QFixed kerning(int left,int right,KernPair *pairs,int numPairs)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  long in_FS_OFFSET;
  int middle;
  uint left_right;
  int local_14;
  int local_10;
  QFixed local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = in_EDI * 0x10000 + in_ESI;
  local_10 = 0;
  local_14 = in_ECX + -1;
  do {
    if (local_14 < local_10) {
      QFixed::QFixed(&local_c,0);
LAB_007618c3:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (QFixed)local_c.val;
    }
    iVar2 = local_10 + (local_14 - local_10 >> 1);
    if (*(uint *)(in_RDX + (long)iVar2 * 8) == uVar1) {
      local_c.val = *(int *)(in_RDX + 4 + (long)iVar2 * 8);
      goto LAB_007618c3;
    }
    if (*(uint *)(in_RDX + (long)iVar2 * 8) < uVar1) {
      local_10 = iVar2 + 1;
    }
    else {
      local_14 = iVar2 + -1;
    }
  } while( true );
}

Assistant:

static inline QFixed kerning(int left, int right, const QFontEngine::KernPair *pairs, int numPairs)
{
    uint left_right = (left << 16) + right;

    left = 0, right = numPairs - 1;
    while (left <= right) {
        int middle = left + ( ( right - left ) >> 1 );

        if (pairs[middle].left_right == left_right)
            return pairs[middle].adjust;

        if (pairs[middle].left_right < left_right)
            left = middle + 1;
        else
            right = middle - 1;
    }
    return 0;
}